

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O2

void Syn_Filt(tetra_codec *st,Word16 *a,Word16 *x,Word16 *y,Word16 lg,Word16 *mem,Word16 update)

{
  Word32 WVar1;
  long lVar2;
  long lVar3;
  Word16 *pWVar4;
  undefined6 in_register_00000082;
  Word16 *pWVar5;
  short local_f4;
  Word16 tmp [80];
  
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 2) {
    *(undefined2 *)((long)tmp + lVar2) = *(undefined2 *)(CONCAT62(in_register_00000082,lg) + lVar2);
  }
  pWVar4 = tmp + 10;
  for (lVar2 = 0; lVar2 != 0x3c; lVar2 = lVar2 + 1) {
    WVar1 = Load_sh(st,x[lVar2],0xc);
    pWVar5 = a + 1;
    for (lVar3 = -1; lVar3 != -0xb; lVar3 = lVar3 + -1) {
      WVar1 = L_msu0(st,WVar1,*pWVar5,pWVar4[lVar3]);
      pWVar5 = pWVar5 + 1;
    }
    WVar1 = add_sh(st,WVar1,1,0xb);
    WVar1 = L_shl(st,WVar1,4);
    *pWVar4 = (Word16)((uint)WVar1 >> 0x10);
    pWVar4 = pWVar4 + 1;
  }
  for (lVar2 = 0; lVar2 != 0x3c; lVar2 = lVar2 + 1) {
    y[lVar2] = tmp[lVar2 + 10];
  }
  local_f4 = (short)mem;
  if (local_f4 != 0) {
    for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
      *(Word16 *)(CONCAT62(in_register_00000082,lg) + lVar2 * 2) = y[lVar2 + 0x32];
    }
  }
  return;
}

Assistant:

void Syn_Filt(tetra_codec* st, Word16 a[], Word16 x[], Word16 y[], Word16 lg, Word16 mem[],
              Word16 update)
{
  Word16 i, j;
  Word32 s;
  Word16 tmp[80];	/* This is usually done by memory allocation (lg+TSC_pp) */
  Word16 *yy;

  /* Copy mem[] to yy[] */

  yy = tmp;

  for(i=0; i<TSC_pp; i++)
    *yy++ = mem[i];


  /* Do the filtering. */

  for (i = 0; i < lg; i++)
  {
    s = Load_sh(st, x[i], (Word16)12);				/* a[] is in Q12 */
    for (j = 1; j <= TSC_pp; j++)
      s = L_msu0(st, s, a[j], yy[-j]);

    s     = add_sh(st, s, (Word16)1, (Word16)11);		/* Rounding */
    *yy++ = extract_h( L_shl(st, s, (Word16)4) );
  }

  for(i=0; i<lg; i++) y[i] = tmp[i+TSC_pp];

  /* Update of memory if update==1 */

  if(update != 0)
     for (i = 0; i < TSC_pp; i++) mem[i] = y[lg-TSC_pp+i];

 return;
}